

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

void __thiscall
OpenMesh::IO::_PLYReader_::readValue(_PLYReader_ *this,ValueType _type,istream *_in,float *_value)

{
  ostream *poVar1;
  float local_1c [2];
  float32_t tmp;
  
  if (_type - ValueTypeFLOAT32 < 2) {
    binary<float>::restore(_in,local_1c,SUB41(((this->options_).flags_ & 2U) >> 1,0));
    *_value = local_1c[0];
    return;
  }
  *_value = 0.0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"unsupported conversion type to float: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,_type);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void _PLYReader_::readValue(ValueType _type, std::istream& _in, float& _value) const {

    switch (_type) {
    case ValueTypeFLOAT32:
    case ValueTypeFLOAT:
        float32_t tmp;
        restore(_in, tmp, options_.check(Options::MSB));
        _value = tmp;
        break;
    default:
        _value = 0.0;
        std::cerr << "unsupported conversion type to float: " << _type << std::endl;
        break;
    }
}